

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__fill_active_edges_new
               (float *scanline,float *scanline_fill,int len,stbtt__active_edge *e,float y_top)

{
  int iVar1;
  int iVar2;
  stbtt__active_edge *in_RCX;
  int in_EDX;
  long in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float y1_00;
  float fVar3;
  float fVar4;
  float x1_00;
  float y1_01;
  float y1_02;
  float fVar5;
  float y2;
  float y1;
  float y3;
  float x3;
  float x2_1;
  float x1_1;
  float y0;
  int x_2;
  float t;
  float area;
  float sign;
  float step;
  float y_crossing;
  int x2;
  int x1;
  int x_1;
  int x;
  float height;
  float dy;
  float sy1;
  float sy0;
  float x_bottom;
  float x_top;
  float xb;
  float dx;
  float x0_1;
  float x0;
  float y_bottom;
  int local_78;
  float local_70;
  int local_58;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_30;
  stbtt__active_edge *local_20;
  
  y1_00 = in_XMM0_Da + 1.0;
  for (local_20 = in_RCX; local_20 != (stbtt__active_edge *)0x0; local_20 = local_20->next) {
    if ((local_20->fdx != 0.0) || (NAN(local_20->fdx))) {
      local_30 = local_20->fx;
      fVar5 = local_20->fdx;
      fVar3 = local_30 + fVar5;
      local_4c = local_20->fdy;
      local_44 = in_XMM0_Da;
      local_3c = local_30;
      if (in_XMM0_Da < local_20->sy) {
        local_44 = local_20->sy;
        local_3c = fVar5 * (local_20->sy - in_XMM0_Da) + local_30;
      }
      local_48 = y1_00;
      local_40 = fVar3;
      if (local_20->ey < y1_00) {
        local_48 = local_20->ey;
        local_40 = fVar5 * (local_20->ey - in_XMM0_Da) + local_30;
      }
      fVar4 = local_40;
      if ((((local_3c < 0.0) || (local_40 < 0.0)) || ((float)in_EDX <= local_3c)) ||
         ((float)in_EDX <= local_40)) {
        for (local_78 = 0; local_78 < in_EDX; local_78 = local_78 + 1) {
          fVar4 = (float)local_78;
          x1_00 = (float)(local_78 + 1);
          y1_01 = ((float)local_78 - local_30) / fVar5 + in_XMM0_Da;
          y1_02 = ((float)(local_78 + 1) - local_30) / fVar5 + in_XMM0_Da;
          if ((fVar4 <= local_30) || (fVar3 <= x1_00)) {
            if ((fVar4 <= fVar3) || (local_30 <= x1_00)) {
              if ((fVar4 <= local_30) || (fVar3 <= fVar4)) {
                if ((fVar4 <= fVar3) || (local_30 <= fVar4)) {
                  if ((x1_00 <= local_30) || (fVar3 <= x1_00)) {
                    if ((x1_00 <= fVar3) || (local_30 <= x1_00)) {
                      stbtt__handle_clipped_edge
                                (in_RDI,local_78,local_20,local_30,in_XMM0_Da,fVar3,y1_00);
                    }
                    else {
                      stbtt__handle_clipped_edge
                                (in_RDI,local_78,local_20,local_30,in_XMM0_Da,x1_00,y1_02);
                      stbtt__handle_clipped_edge(in_RDI,local_78,local_20,x1_00,y1_02,fVar3,y1_00);
                    }
                  }
                  else {
                    stbtt__handle_clipped_edge
                              (in_RDI,local_78,local_20,local_30,in_XMM0_Da,x1_00,y1_02);
                    stbtt__handle_clipped_edge(in_RDI,local_78,local_20,x1_00,y1_02,fVar3,y1_00);
                  }
                }
                else {
                  stbtt__handle_clipped_edge
                            (in_RDI,local_78,local_20,local_30,in_XMM0_Da,fVar4,y1_01);
                  stbtt__handle_clipped_edge(in_RDI,local_78,local_20,fVar4,y1_01,fVar3,y1_00);
                }
              }
              else {
                stbtt__handle_clipped_edge(in_RDI,local_78,local_20,local_30,in_XMM0_Da,fVar4,y1_01)
                ;
                stbtt__handle_clipped_edge(in_RDI,local_78,local_20,fVar4,y1_01,fVar3,y1_00);
              }
            }
            else {
              stbtt__handle_clipped_edge(in_RDI,local_78,local_20,local_30,in_XMM0_Da,x1_00,y1_02);
              stbtt__handle_clipped_edge(in_RDI,local_78,local_20,x1_00,y1_02,fVar4,y1_01);
              stbtt__handle_clipped_edge(in_RDI,local_78,local_20,fVar4,y1_01,fVar3,y1_00);
            }
          }
          else {
            stbtt__handle_clipped_edge(in_RDI,local_78,local_20,local_30,in_XMM0_Da,fVar4,y1_01);
            stbtt__handle_clipped_edge(in_RDI,local_78,local_20,fVar4,y1_01,x1_00,y1_02);
            stbtt__handle_clipped_edge(in_RDI,local_78,local_20,x1_00,y1_02,fVar3,y1_00);
          }
        }
      }
      else if ((int)local_3c == (int)local_40) {
        iVar1 = (int)local_3c;
        in_RDI[iVar1] =
             local_20->direction *
             (1.0 - ((local_3c - (float)iVar1) + (local_40 - (float)iVar1)) / 2.0) *
             (local_48 - local_44) + in_RDI[iVar1];
        *(float *)(in_RSI + (long)iVar1 * 4) =
             local_20->direction * (local_48 - local_44) + *(float *)(in_RSI + (long)iVar1 * 4);
      }
      else {
        if (local_40 < local_3c) {
          fVar5 = local_44 - in_XMM0_Da;
          local_44 = y1_00 - (local_48 - in_XMM0_Da);
          local_40 = local_3c;
          local_3c = fVar4;
          local_4c = -local_4c;
          local_48 = y1_00 - fVar5;
          local_30 = fVar3;
        }
        iVar1 = (int)local_3c;
        iVar2 = (int)local_40;
        fVar3 = ((float)(iVar1 + 1) - local_30) * local_4c + in_XMM0_Da;
        fVar5 = local_20->direction;
        local_70 = fVar5 * (fVar3 - local_44);
        in_RDI[iVar1] = local_70 * (1.0 - ((local_3c - (float)iVar1) + 1.0) / 2.0) + in_RDI[iVar1];
        local_58 = iVar1;
        while (local_58 = local_58 + 1, local_58 < iVar2) {
          in_RDI[local_58] = local_70 + (fVar5 * local_4c) / 2.0 + in_RDI[local_58];
          local_70 = fVar5 * local_4c + local_70;
        }
        in_RDI[iVar2] =
             fVar5 * (1.0 - ((local_40 - (float)iVar2) + 0.0) / 2.0) *
             (local_48 - (local_4c * (float)(iVar2 - (iVar1 + 1)) + fVar3)) + local_70 +
             in_RDI[iVar2];
        *(float *)(in_RSI + (long)iVar2 * 4) =
             fVar5 * (local_48 - local_44) + *(float *)(in_RSI + (long)iVar2 * 4);
      }
    }
    else {
      fVar5 = local_20->fx;
      if (fVar5 < (float)in_EDX) {
        if (fVar5 < 0.0) {
          stbtt__handle_clipped_edge((float *)(in_RSI + -4),0,local_20,fVar5,in_XMM0_Da,fVar5,y1_00)
          ;
        }
        else {
          stbtt__handle_clipped_edge(in_RDI,(int)fVar5,local_20,fVar5,in_XMM0_Da,fVar5,y1_00);
          stbtt__handle_clipped_edge
                    ((float *)(in_RSI + -4),(int)fVar5 + 1,local_20,fVar5,in_XMM0_Da,fVar5,y1_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void stbtt__fill_active_edges_new(float *scanline, float *scanline_fill, int len, stbtt__active_edge *e, float y_top)
{
   float y_bottom = y_top+1;

   while (e) {
      // brute force every pixel

      // compute intersection points with top & bottom
      STBTT_assert(e->ey >= y_top);

      if (e->fdx == 0) {
         float x0 = e->fx;
         if (x0 < len) {
            if (x0 >= 0) {
               stbtt__handle_clipped_edge(scanline,(int) x0,e, x0,y_top, x0,y_bottom);
               stbtt__handle_clipped_edge(scanline_fill-1,(int) x0+1,e, x0,y_top, x0,y_bottom);
            } else {
               stbtt__handle_clipped_edge(scanline_fill-1,0,e, x0,y_top, x0,y_bottom);
            }
         }
      } else {
         float x0 = e->fx;
         float dx = e->fdx;
         float xb = x0 + dx;
         float x_top, x_bottom;
         float sy0,sy1;
         float dy = e->fdy;
         STBTT_assert(e->sy <= y_bottom && e->ey >= y_top);

         // compute endpoints of line segment clipped to this scanline (if the
         // line segment starts on this scanline. x0 is the intersection of the
         // line with y_top, but that may be off the line segment.
         if (e->sy > y_top) {
            x_top = x0 + dx * (e->sy - y_top);
            sy0 = e->sy;
         } else {
            x_top = x0;
            sy0 = y_top;
         }
         if (e->ey < y_bottom) {
            x_bottom = x0 + dx * (e->ey - y_top);
            sy1 = e->ey;
         } else {
            x_bottom = xb;
            sy1 = y_bottom;
         }

         if (x_top >= 0 && x_bottom >= 0 && x_top < len && x_bottom < len) {
            // from here on, we don't have to range check x values

            if ((int) x_top == (int) x_bottom) {
               float height;
               // simple case, only spans one pixel
               int x = (int) x_top;
               height = sy1 - sy0;
               STBTT_assert(x >= 0 && x < len);
               scanline[x] += e->direction * (1-((x_top - x) + (x_bottom-x))/2)  * height;
               scanline_fill[x] += e->direction * height; // everything right of this pixel is filled
            } else {
               int x,x1,x2;
               float y_crossing, step, sign, area;
               // covers 2+ pixels
               if (x_top > x_bottom) {
                  // flip scanline vertically; signed area is the same
                  float t;
                  sy0 = y_bottom - (sy0 - y_top);
                  sy1 = y_bottom - (sy1 - y_top);
                  t = sy0, sy0 = sy1, sy1 = t;
                  t = x_bottom, x_bottom = x_top, x_top = t;
                  dx = -dx;
                  dy = -dy;
                  t = x0, x0 = xb, xb = t;
               }

               x1 = (int) x_top;
               x2 = (int) x_bottom;
               // compute intersection with y axis at x1+1
               y_crossing = (x1+1 - x0) * dy + y_top;

               sign = e->direction;
               // area of the rectangle covered from y0..y_crossing
               area = sign * (y_crossing-sy0);
               // area of the triangle (x_top,y0), (x+1,y0), (x+1,y_crossing)
               scanline[x1] += area * (1-((x_top - x1)+(x1+1-x1))/2);

               step = sign * dy;
               for (x = x1+1; x < x2; ++x) {
                  scanline[x] += area + step/2;
                  area += step;
               }
               y_crossing += dy * (x2 - (x1+1));

               STBTT_assert(STBTT_fabs(area) <= 1.01f);

               scanline[x2] += area + sign * (1-((x2-x2)+(x_bottom-x2))/2) * (sy1-y_crossing);

               scanline_fill[x2] += sign * (sy1-sy0);
            }
         } else {
            // if edge goes outside of box we're drawing, we require
            // clipping logic. since this does not match the intended use
            // of this library, we use a different, very slow brute
            // force implementation
            int x;
            for (x=0; x < len; ++x) {
               // cases:
               //
               // there can be up to two intersections with the pixel. any intersection
               // with left or right edges can be handled by splitting into two (or three)
               // regions. intersections with top & bottom do not necessitate case-wise logic.
               //
               // the old way of doing this found the intersections with the left & right edges,
               // then used some simple logic to produce up to three segments in sorted order
               // from top-to-bottom. however, this had a problem: if an x edge was epsilon
               // across the x border, then the corresponding y position might not be distinct
               // from the other y segment, and it might ignored as an empty segment. to avoid
               // that, we need to explicitly produce segments based on x positions.

               // rename variables to clearly-defined pairs
               float y0 = y_top;
               float x1 = (float) (x);
               float x2 = (float) (x+1);
               float x3 = xb;
               float y3 = y_bottom;

               // x = e->x + e->dx * (y-y_top)
               // (y-y_top) = (x - e->x) / e->dx
               // y = (x - e->x) / e->dx + y_top
               float y1 = (x - x0) / dx + y_top;
               float y2 = (x+1 - x0) / dx + y_top;

               if (x0 < x1 && x3 > x2) {         // three segments descending down-right
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
               } else if (x3 < x1 && x0 > x2) {  // three segments descending down-left
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x3,y3);
               } else if (x0 < x1 && x3 > x1) {  // two segments across x, down-right
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x3,y3);
               } else if (x3 < x1 && x0 > x1) {  // two segments across x, down-left
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x1,y1);
                  stbtt__handle_clipped_edge(scanline,x,e, x1,y1, x3,y3);
               } else if (x0 < x2 && x3 > x2) {  // two segments across x+1, down-right
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
               } else if (x3 < x2 && x0 > x2) {  // two segments across x+1, down-left
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x2,y2);
                  stbtt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
               } else {  // one segment
                  stbtt__handle_clipped_edge(scanline,x,e, x0,y0, x3,y3);
               }
            }
         }
      }
      e = e->next;
   }
}